

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal-base.h
# Opt level: O3

void __thiscall dynamicgraph::SignalBase<int>::plug(SignalBase<int> *this,SignalBase<int> *sigarg)

{
  ExceptionSignal *this_00;
  ErrorCodeEnum local_4c;
  undefined1 *local_48 [2];
  undefined1 local_38 [16];
  
  this_00 = (ExceptionSignal *)__cxa_allocate_exception(0x30);
  local_4c = PLUG_IMPOSSIBLE;
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_48,"Plug-in operation not possible with this signal. ","");
  dynamicgraph::ExceptionSignal::ExceptionSignal
            (this_00,&local_4c,(string *)local_48,"(while trying to plug %s on %s).",
             (sigarg->name)._M_dataplus._M_p,(this->name)._M_dataplus._M_p);
  __cxa_throw(this_00,&ExceptionSignal::typeinfo,ExceptionAbstract::~ExceptionAbstract);
}

Assistant:

virtual void plug(SignalBase<Time> *sigarg) {
    DG_THROW ExceptionSignal(
        ExceptionSignal::PLUG_IMPOSSIBLE,
        "Plug-in operation not possible with this signal. ",
        "(while trying to plug %s on %s).", sigarg->getName().c_str(),
        this->getName().c_str());
  }